

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

SplitTuplePromise<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> * __thiscall
kj::_::ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>>::splitImpl<0ul,1ul,2ul>
          (ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_>
           *__return_storage_ptr__,ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *this,
          undefined8 param_3,undefined8 param_4,Promise<int> *param_5)

{
  Promise<kj::String> local_60 [2];
  Promise<int> local_40;
  Promise<int> local_30;
  ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *local_20;
  ForkHub<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> *this_local;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Promise<int>,_kj::Promise<kj::String>,_kj::Promise<int>_>
  *local_10;
  
  local_20 = this;
  local_10 = __return_storage_ptr__;
  addSplit<0ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_30);
  addSplit<1ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)&local_40);
  addSplit<2ul>((ForkHub<kj::_::Tuple<int,kj::String,kj::Promise<int>>> *)local_60);
  tuple<kj::Promise<int>,kj::Promise<kj::String>,kj::Promise<int>>
            (__return_storage_ptr__,(kj *)&local_30,&local_40,local_60,param_5);
  Promise<int>::~Promise((Promise<int> *)local_60);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_40);
  Promise<int>::~Promise(&local_30);
  return __return_storage_ptr__;
}

Assistant:

_::SplitTuplePromise<T> splitImpl(Indexes<indexes...>) {
    return kj::tuple(addSplit<indexes>()...);
  }